

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

string * __thiscall
pbrt::HairBxDF::ToString_abi_cxx11_(string *__return_storage_ptr__,HairBxDF *this)

{
  SampledSpectrum *in_RAX;
  
  StringPrintf<float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,pbrt::SampledSpectrum_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ HairBxDF h: %f gamma_o: %f eta: %f beta_m: %f beta_n: %f v[0]: %f s: %f sigma_a: %s ]"
             ,(char *)this,&this->gamma_o,&this->eta,&this->beta_m,&this->beta_n,this->v,&this->s,
             (float *)&this->sigma_a,in_RAX);
  return __return_storage_ptr__;
}

Assistant:

std::string HairBxDF::ToString() const {
    return StringPrintf("[ HairBxDF h: %f gamma_o: %f eta: %f beta_m: %f beta_n: %f "
                        "v[0]: %f s: %f sigma_a: %s ]",
                        h, gamma_o, eta, beta_m, beta_n, v[0], s, sigma_a);
}